

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

void deqp::gls::StateQueryUtil::queryAttributeState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,int index,
               QueriedState *state)

{
  bool bVar1;
  char *msg;
  StateQueryMemoryWriteGuard<int> value;
  StateQueryMemoryWriteGuard<float> local_34;
  
  switch(type) {
  case QUERY_ATTRIBUTE_INTEGER:
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)&local_34);
    glu::CallLogWrapper::glGetVertexAttribiv(gl,index,target,(GLint *)&local_34.m_value);
    msg = "glGetVertexAttribiv";
    break;
  case QUERY_ATTRIBUTE_FLOAT:
    StateQueryMemoryWriteGuard<float>::StateQueryMemoryWriteGuard(&local_34);
    glu::CallLogWrapper::glGetVertexAttribfv(gl,index,target,&local_34.m_value);
    bVar1 = checkError(result,gl,"glGetVertexAttribfv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<float>::verifyValidity(&local_34,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_FLOAT;
    (state->m_v).vInt = (GLint)local_34.m_value;
    return;
  case QUERY_ATTRIBUTE_PURE_INTEGER:
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)&local_34);
    glu::CallLogWrapper::glGetVertexAttribIiv(gl,index,target,(GLint *)&local_34.m_value);
    msg = "glGetVertexAttribIiv";
    break;
  case QUERY_ATTRIBUTE_PURE_UNSIGNED_INTEGER:
    StateQueryMemoryWriteGuard<unsigned_int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<unsigned_int> *)&local_34);
    glu::CallLogWrapper::glGetVertexAttribIuiv(gl,index,target,(GLuint *)&local_34.m_value);
    bVar1 = checkError(result,gl,"glGetVertexAttribIuiv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<unsigned_int>::verifyValidity
                      ((StateQueryMemoryWriteGuard<unsigned_int> *)&local_34,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_UNSIGNED_INTEGER;
    goto LAB_00453f4b;
  default:
    goto switchD_00453e80_default;
  }
  bVar1 = checkError(result,gl,msg);
  if ((bVar1) &&
     (bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                        ((StateQueryMemoryWriteGuard<int> *)&local_34,result), bVar1)) {
    state->m_type = DATATYPE_INTEGER;
LAB_00453f4b:
    (state->m_v).vInt = (GLint)local_34.m_value;
  }
switchD_00453e80_default:
  return;
}

Assistant:

void queryAttributeState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, int index, QueriedState& state)
{
	switch (type)
	{
		case QUERY_ATTRIBUTE_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetVertexAttribiv(index, target, &value);

			if (!checkError(result, gl, "glGetVertexAttribiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_ATTRIBUTE_FLOAT:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat> value;
			gl.glGetVertexAttribfv(index, target, &value);

			if (!checkError(result, gl, "glGetVertexAttribfv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_ATTRIBUTE_PURE_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetVertexAttribIiv(index, target, &value);

			if (!checkError(result, gl, "glGetVertexAttribIiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_ATTRIBUTE_PURE_UNSIGNED_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLuint> value;
			gl.glGetVertexAttribIuiv(index, target, &value);

			if (!checkError(result, gl, "glGetVertexAttribIuiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}